

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O2

int list_pins(void)

{
  int iVar1;
  int iVar2;
  
  iVar1 = list_platform_pins('\0');
  iVar2 = list_platform_pins('\x01');
  if (iVar2 + iVar1 == 0) {
    fwrite("No Pins\n",8,1,_stdout);
  }
  return iVar2 + iVar1;
}

Assistant:

int
list_pins()
{
    int pin_count = 0;
    pin_count += list_platform_pins(MRAA_MAIN_PLATFORM_OFFSET);
    pin_count += list_platform_pins(MRAA_SUB_PLATFORM_OFFSET);
    if (pin_count == 0) {
        fprintf(stdout, "No Pins\n");
    }
    return pin_count;
}